

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r7pfr.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  
  bVar1 = testR7Pfr();
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"R7Pfr test did not pass\n",0x18);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"R7Pfr test passed\n",0x12);
  }
  return (uint)!bVar1;
}

Assistant:

int main(int argc, char ** argv){


if(testR7Pfr()){
    std::cout << "R7Pfr test passed\n";
}else{
    std::cerr << "R7Pfr test did not pass\n";
    return 1;
};

return 0;
}